

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::read<pbrt::Object>(BinaryReader *this,shared_ptr<pbrt::Object> *t)

{
  undefined8 in_RSI;
  int ID_00;
  BinaryReader *in_RDI;
  int32_t ID;
  shared_ptr<pbrt::Object> *in_stack_ffffffffffffffc8;
  BinaryReader *this_00;
  
  ID_00 = (int)((ulong)in_RSI >> 0x20);
  this_00 = in_RDI;
  read<int,void>(in_RDI,(int *)in_stack_ffffffffffffffc8);
  getEntity<pbrt::Object>(this_00,ID_00);
  std::shared_ptr<pbrt::Object>::operator=
            ((shared_ptr<pbrt::Object> *)in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x12bbde);
  return;
}

Assistant:

inline void read(std::shared_ptr<T> &t)
    {
      int32_t ID;
      read(ID);
      t = getEntity<T>(ID);
    }